

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O3

void Ntk_SymFunDeriveNpn(word *pFun,int nVars,int *pComp)

{
  int iVar1;
  word wVar2;
  uint uVar3;
  long lVar4;
  void *__dest;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  ulong uVar14;
  word *pLimit;
  
  uVar3 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  uVar9 = (ulong)uVar3;
  __dest = calloc((long)(int)uVar3,8);
  uVar14 = uVar9;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      *(word *)((long)__dest + uVar5 * 8) = ~pFun[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
  }
  do {
    if ((int)uVar14 < 1) goto LAB_0031948b;
    uVar5 = *(ulong *)((long)__dest + uVar14 * 8 + -8);
    lVar4 = uVar14 - 1;
    uVar14 = uVar14 - 1;
  } while (uVar5 == pFun[lVar4]);
  if ((0 < (int)uVar3) && (pFun[lVar4] <= uVar5)) {
    memcpy(__dest,pFun,uVar9 * 8);
  }
LAB_0031948b:
  if (nVars != 0x1f) {
    uVar14 = 0;
    do {
      iVar1 = pComp[uVar14];
      uVar5 = uVar9;
      if (uVar3 == 1) {
        bVar6 = (byte)(1L << ((byte)iVar1 & 0x3f));
        *pFun = (s_Truths6[iVar1] & *pFun) >> (bVar6 & 0x3f) |
                *pFun << (bVar6 & 0x3f) & s_Truths6[iVar1];
      }
      else if (iVar1 < 6) {
        if (0 < (int)uVar3) {
          uVar7 = s_Truths6[iVar1];
          uVar11 = 0;
          do {
            bVar6 = (byte)(1L << ((byte)iVar1 & 0x3f));
            pFun[uVar11] = (pFun[uVar11] & uVar7) >> (bVar6 & 0x3f) |
                           pFun[uVar11] << (bVar6 & 0x3f) & uVar7;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
      }
      else if (0 < (int)uVar3) {
        bVar6 = (byte)(iVar1 + -6);
        uVar8 = 1 << (bVar6 & 0x1f);
        iVar10 = 2 << (bVar6 & 0x1f);
        uVar7 = 1;
        if (1 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        pwVar12 = pFun + (int)uVar8;
        pwVar13 = pFun;
        do {
          if (iVar1 + -6 != 0x1f) {
            uVar11 = 0;
            do {
              wVar2 = pwVar13[uVar11];
              pwVar13[uVar11] = pwVar12[uVar11];
              pwVar12[uVar11] = wVar2;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
          }
          pwVar13 = pwVar13 + iVar10;
          pwVar12 = pwVar12 + iVar10;
        } while (pwVar13 < pFun + (int)uVar3);
      }
      do {
        uVar7 = uVar9;
        if ((int)uVar5 < 1) goto LAB_003195c3;
        lVar4 = uVar5 - 1;
        uVar11 = *(ulong *)((long)__dest + uVar5 * 8 + -8);
        uVar5 = uVar5 - 1;
      } while (uVar11 == pFun[lVar4]);
      if (uVar11 < pFun[lVar4]) {
LAB_003195c3:
        if (0 < (int)uVar3) {
LAB_003195e1:
          uVar5 = 0;
          do {
            pFun[uVar5] = ~pFun[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        }
      }
      else if (0 < (int)uVar3) {
        memcpy(__dest,pFun,uVar9 * 8);
        goto LAB_003195e1;
      }
      do {
        if ((int)uVar7 < 1) goto LAB_00319625;
        uVar5 = *(ulong *)((long)__dest + uVar7 * 8 + -8);
        lVar4 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (uVar5 == pFun[lVar4]);
      if ((0 < (int)uVar3) && (pFun[lVar4] <= uVar5)) {
        memcpy(__dest,pFun,uVar9 * 8);
      }
LAB_00319625:
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)(1 << ((byte)nVars & 0x1f)));
  }
  if ((int)uVar3 < 1) {
    if (__dest == (void *)0x0) {
      return;
    }
  }
  else {
    memcpy(pFun,__dest,uVar9 * 8);
  }
  free(__dest);
  return;
}

Assistant:

void Ntk_SymFunDeriveNpn( word * pFun, int nVars, int * pComp )
{
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunB = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunB, pFun, nWords, 1 );
    if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
        Abc_TtCopy( pFunB, pFun, nWords, 0 );
    for ( i = 0; i < (1 << nVars); i++ )
    {
        Abc_TtFlip( pFun, nWords, pComp[i] );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
        Abc_TtNot( pFun, nWords );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
    }
    //Ntk_SymTryRandomFlips( pFun, pFunB, nVars );
    Abc_TtCopy( pFun, pFunB, nWords, 0 );
    ABC_FREE( pFunB );
}